

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceHPoint.cpp
# Opt level: O2

HPoint __thiscall IceMaths::HPoint::operator*(HPoint *this,Matrix4x4 *mat)

{
  float afVar1 [4];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float *in_RDI;
  HPoint HVar12;
  
  fVar2 = (this->super_Point).x;
  fVar3 = (this->super_Point).y;
  fVar4 = (this->super_Point).z;
  fVar5 = this->w;
  fVar6 = mat->m[0][2];
  fVar7 = mat->m[0][3];
  fVar8 = mat->m[1][2];
  fVar9 = mat->m[1][3];
  afVar1 = mat->m[2];
  HVar12._8_8_ = afVar1._0_8_;
  fVar10 = mat->m[3][2];
  fVar11 = mat->m[3][3];
  HVar12.super_Point.x =
       fVar5 * mat->m[3][0] + fVar4 * afVar1[0] + fVar2 * mat->m[0][0] + mat->m[1][0] * fVar3;
  HVar12.super_Point.y =
       fVar5 * mat->m[3][1] + fVar4 * afVar1[1] + fVar2 * mat->m[0][1] + mat->m[1][1] * fVar3;
  *in_RDI = HVar12.super_Point.x;
  in_RDI[1] = HVar12.super_Point.y;
  in_RDI[2] = fVar5 * fVar10 + fVar4 * afVar1[2] + fVar2 * fVar6 + fVar8 * fVar3;
  in_RDI[3] = fVar5 * fVar11 + fVar4 * afVar1[3] + fVar2 * fVar7 + fVar9 * fVar3;
  return HVar12;
}

Assistant:

HPoint HPoint::operator*(const Matrix4x4& mat) const
{
	return HPoint(
	x * mat.m[0][0] + y * mat.m[1][0] + z * mat.m[2][0] + w * mat.m[3][0],
	x * mat.m[0][1] + y * mat.m[1][1] + z * mat.m[2][1] + w * mat.m[3][1],
	x * mat.m[0][2] + y * mat.m[1][2] + z * mat.m[2][2] + w * mat.m[3][2],
	x * mat.m[0][3] + y * mat.m[1][3] + z * mat.m[2][3] + w * mat.m[3][3]);
}